

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O0

bool __thiscall bssl::DTLS1_STATE::Init(DTLS1_STATE *this)

{
  bool bVar1;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_28;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_20;
  DTLS1_STATE *local_18;
  DTLS1_STATE *this_local;
  
  local_18 = this;
  SSLAEADContext::CreateNullCipher();
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator=
            (&(this->read_epoch).aead,&local_20);
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  SSLAEADContext::CreateNullCipher();
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator=
            (&(this->write_epoch).aead,&local_28);
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  bVar1 = std::operator==(&(this->read_epoch).aead,(nullptr_t)0x0);
  if ((!bVar1) && (bVar1 = std::operator==(&(this->write_epoch).aead,(nullptr_t)0x0), !bVar1)) {
    return true;
  }
  return false;
}

Assistant:

bool DTLS1_STATE::Init() {
  // Set up the initial epochs.
  read_epoch.aead = SSLAEADContext::CreateNullCipher();
  write_epoch.aead = SSLAEADContext::CreateNullCipher();
  if (read_epoch.aead == nullptr || write_epoch.aead == nullptr) {
    return false;
  }

  return true;
}